

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O2

void __thiscall
btConvexConvexAlgorithm::processCollision::btWithoutMarginResult::addContactPoint
          (btWithoutMarginResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorldOrg,
          btScalar depthOrg)

{
  undefined8 uVar1;
  float fVar2;
  btVector3 adjustedPointB;
  btScalar local_38 [4];
  btVector3 local_28;
  
  this->m_reportedDistance = depthOrg;
  uVar1 = *(undefined8 *)(normalOnBInWorld->m_floats + 2);
  *(undefined8 *)(this->m_reportedNormalOnWorld).m_floats =
       *(undefined8 *)normalOnBInWorld->m_floats;
  *(undefined8 *)((this->m_reportedNormalOnWorld).m_floats + 2) = uVar1;
  local_28 = operator*(normalOnBInWorld,&this->m_marginOnB);
  local_38 = (btScalar  [4])operator-(pointInWorldOrg,&local_28);
  fVar2 = this->m_marginOnA + this->m_marginOnB + depthOrg;
  this->m_reportedDistance = fVar2;
  if (fVar2 < 0.0) {
    this->m_foundResult = true;
  }
  (*this->m_originalResult->_vptr_Result[4])(this->m_originalResult,normalOnBInWorld,local_38);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorldOrg,btScalar depthOrg) 
			{
				m_reportedDistance = depthOrg;
				m_reportedNormalOnWorld = normalOnBInWorld;
				
				btVector3 adjustedPointB = pointInWorldOrg - normalOnBInWorld*m_marginOnB;
				m_reportedDistance = depthOrg+(m_marginOnA+m_marginOnB);
				if (m_reportedDistance<0.f)
				{
					m_foundResult = true;					
				}
				m_originalResult->addContactPoint(normalOnBInWorld,adjustedPointB,m_reportedDistance);
			}